

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O3

char * flatcc_json_parser_build_uint8_vector_base64
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *ref,
                 int urlsafe)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  flatcc_builder_ref_t fVar5;
  char *pcVar6;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 *puVar14;
  char *pcVar15;
  ulong uVar16;
  size_t count;
  char *buf_00;
  bool bVar17;
  byte local_50 [4];
  int local_4c;
  size_t local_48;
  ulong local_40;
  byte *local_38;
  
  if ((buf == end) || (*buf != '\"')) {
    buf_00 = end;
    if (ctx->error == 0) {
      ctx->error = 0x10;
      ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
      ctx->error_loc = buf;
    }
  }
  else {
    buf_00 = buf + 1;
  }
  pcVar6 = flatcc_json_parser_string_part(ctx,buf_00,end);
  if ((pcVar6 != end) && (*pcVar6 == '\"')) {
    uVar11 = (long)pcVar6 - (long)buf_00;
    uVar3 = (uint)uVar11 & 3;
    local_48 = (uVar11 >> 2) * 3;
    if (uVar3 == 2) {
      local_48 = local_48 + 1;
    }
    else if (uVar3 == 3) {
      local_48 = local_48 + 2;
    }
    local_4c = urlsafe;
    iVar4 = flatcc_builder_start_vector(ctx->ctx,1,1,0xffffffff);
    if ((iVar4 == 0) &&
       (local_38 = (byte *)flatcc_builder_extend_vector(ctx->ctx,local_48), local_38 != (byte *)0x0)
       ) {
      puVar14 = base64_decode_base64url_decode;
      if (local_4c == 0) {
        puVar14 = base64_decode_base64rfc4648_decode;
      }
      uVar12 = -(ulong)(local_48 == 0) | local_48;
      pbVar7 = local_38;
      uVar9 = uVar11;
      pcVar15 = buf_00;
      do {
        uVar16 = 0;
        uVar8 = uVar9;
        do {
          if (uVar8 == uVar16) {
            uVar10 = 0;
            goto LAB_00124bab;
          }
          bVar1 = puVar14[(byte)pcVar15[uVar16]];
          local_50[uVar16] = bVar1;
          if (0x3f < bVar1) {
            if (bVar1 != 0x41) {
              uVar13 = uVar16;
              uVar10 = uVar16;
              if (bVar1 == 0x42) goto LAB_00124b77;
              goto LAB_00124ba3;
            }
            pcVar15 = pcVar15 + 1;
            uVar8 = uVar8 - 1;
            uVar16 = uVar16 - 1;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < 4);
        bVar17 = uVar12 < 3;
        uVar12 = uVar12 - 3;
        uVar16 = uVar9;
        if (bVar17) goto LAB_00124c26;
        *pbVar7 = local_50[1] >> 4 | local_50[0] << 2;
        pbVar7[1] = local_50[2] >> 2 | local_50[1] << 4;
        pbVar7[2] = local_50[2] << 6 | local_50[3];
        pbVar7 = pbVar7 + 3;
        pcVar15 = pcVar15 + 4;
        uVar9 = uVar8 - 4;
        uVar16 = uVar9;
      } while (uVar12 != 0);
      goto LAB_00124c19;
    }
LAB_00124a5f:
    *ref = 0;
    if (ctx->error != 0) {
      return end;
    }
    ctx->error = 0x23;
    goto LAB_00124c4d;
  }
  goto LAB_00124c30;
  while (lVar2 = uVar13 + 1, uVar13 = uVar13 + 1, (byte)(puVar14[(byte)pcVar15[lVar2]] + 0xbf) < 2)
  {
LAB_00124b77:
    uVar10 = uVar13 + 1;
    local_40 = uVar9;
    if ((6 < uVar13) || (uVar8 <= uVar10)) break;
  }
LAB_00124ba3:
  uVar10 = uVar8 - uVar10;
  uVar8 = uVar16;
LAB_00124bab:
  uVar16 = uVar10;
  if (uVar8 == 0) {
LAB_00124c19:
    if (uVar16 == 0) {
      count = local_48 - ((long)pbVar7 - (long)local_38);
      if ((local_48 < (ulong)((long)pbVar7 - (long)local_38) || count == 0) ||
         (iVar4 = flatcc_builder_truncate_vector(ctx->ctx,count), iVar4 == 0)) {
        fVar5 = flatcc_builder_end_vector(ctx->ctx);
        *ref = fVar5;
        if (fVar5 != 0) {
          if (*pcVar6 == '\"') {
            return pcVar6 + 1;
          }
          if (ctx->error != 0) {
            return end;
          }
          ctx->error = 0x14;
          goto LAB_00124c4d;
        }
      }
      goto LAB_00124a5f;
    }
  }
  else if (uVar8 == 3) {
    uVar16 = uVar9;
    if (((local_50[2] & 3) == 0) && (uVar12 != 1)) {
      *pbVar7 = local_50[1] >> 4 | local_50[0] << 2;
      pbVar7[1] = local_50[2] >> 2 | local_50[1] << 4;
      pbVar7 = pbVar7 + 2;
      uVar16 = uVar10;
      goto LAB_00124c19;
    }
  }
  else {
    uVar16 = uVar9;
    if ((uVar8 == 2) && ((local_50[1] & 0xf) == 0)) {
      *pbVar7 = local_50[1] >> 4 | local_50[0] << 2;
      pbVar7 = pbVar7 + 1;
      uVar16 = uVar10;
      goto LAB_00124c19;
    }
  }
LAB_00124c26:
  pcVar6 = buf_00 + (uVar11 - uVar16);
  urlsafe = local_4c;
LAB_00124c30:
  *ref = 0;
  if (ctx->error != 0) {
    return end;
  }
  ctx->error = 0x20 - (uint)(urlsafe == 0);
LAB_00124c4d:
  ctx->pos = ((int)pcVar6 - *(int *)&ctx->line_start) + 1;
  ctx->error_loc = pcVar6;
  return end;
}

Assistant:

const char *flatcc_json_parser_build_uint8_vector_base64(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, flatcc_builder_ref_t *ref, int urlsafe)
{
    const char *mark;
    uint8_t *pval;
    size_t max_len;
    size_t decoded_len, src_len;
    int mode;
    int ret;

    mode = urlsafe ? base64_mode_url : base64_mode_rfc4648;
    buf = flatcc_json_parser_string_start(ctx, buf, end);
    buf = flatcc_json_parser_string_part(ctx, (mark = buf), end);
    if (buf == end || *buf != '\"') {
        goto base64_failed;
    }
    max_len = base64_decoded_size((size_t)(buf - mark));
    if (flatcc_builder_start_vector(ctx->ctx, 1, 1, FLATBUFFERS_COUNT_MAX((utype_size)))) {
        goto failed;
    }
    if (!(pval = flatcc_builder_extend_vector(ctx->ctx, max_len))) {
        goto failed;
    }
    src_len = (size_t)(buf - mark);
    decoded_len = max_len;
    if ((ret = base64_decode(pval, (const uint8_t *)mark, &decoded_len, &src_len, mode))) {
        buf = mark + src_len;
        goto base64_failed;
    }
    if (src_len != (size_t)(buf - mark)) {
        buf = mark + src_len;
        goto base64_failed;
    }
    if (decoded_len < max_len) {
        if (flatcc_builder_truncate_vector(ctx->ctx, max_len - decoded_len)) {
            goto failed;
        }
    }
    if (!(*ref = flatcc_builder_end_vector(ctx->ctx))) {
        goto failed;
    }
    return flatcc_json_parser_string_end(ctx, buf, end);

failed:
    *ref = 0;
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);

base64_failed:
    *ref = 0;
    return flatcc_json_parser_set_error(ctx, buf, end,
            urlsafe ? flatcc_json_parser_error_base64url : flatcc_json_parser_error_base64);
}